

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

_Bool GPU_GetFullscreen(void)

{
  uint uVar1;
  GPU_Target *pGVar2;
  undefined8 uVar3;
  GPU_Target *target;
  
  pGVar2 = GPU_GetContextTarget();
  if (pGVar2 == (GPU_Target *)0x0) {
    target._7_1_ = false;
  }
  else {
    uVar3 = SDL_GetWindowFromID(pGVar2->context->windowID);
    uVar1 = SDL_GetWindowFlags(uVar3);
    target._7_1_ = (uVar1 & 0x1001) != 0;
  }
  return target._7_1_;
}

Assistant:

GPU_bool GPU_GetFullscreen(void)
{
#ifdef SDL_GPU_USE_SDL2
    GPU_Target* target = GPU_GetContextTarget();
    if(target == NULL)
        return GPU_FALSE;
    return (SDL_GetWindowFlags(SDL_GetWindowFromID(target->context->windowID))
                   & (SDL_WINDOW_FULLSCREEN | SDL_WINDOW_FULLSCREEN_DESKTOP)) != 0;
#else
    SDL_Surface* surf = SDL_GetVideoSurface();
    if(surf == NULL)
        return GPU_FALSE;
    return (surf->flags & SDL_FULLSCREEN) != 0;
#endif
}